

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O3

string * __thiscall
cmCTestVC::ComputeCommandLine_abi_cxx11_(string *__return_storage_ptr__,cmCTestVC *this,char **cmd)

{
  _func_int **__s;
  cmCTest *pcVar1;
  size_t sVar2;
  char *__s_00;
  cmCTest **ppcVar3;
  ostringstream line;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (this->_vptr_cmCTestVC != (_func_int **)0x0) {
    ppcVar3 = &this->CTest;
    __s_00 = "";
    do {
      sVar2 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      __s = ((cmCTestVC *)(ppcVar3 + -1))->_vptr_cmCTestVC;
      if (__s == (_func_int **)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar2 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      pcVar1 = *ppcVar3;
      ppcVar3 = ppcVar3 + 1;
      __s_00 = " ";
    } while (pcVar1 != (cmCTest *)0x0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::ComputeCommandLine(char const* const* cmd)
{
  std::ostringstream line;
  const char* sep = "";
  for(const char* const* arg = cmd; *arg; ++arg)
    {
    line << sep << "\"" << *arg << "\"";
    sep = " ";
    }
  return line.str();
}